

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O1

void __thiscall
wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr
          (RefPtr<wabt::interp::Trap> *this,Store *store,Ref ref)

{
  Trap *pTVar1;
  Index IVar2;
  Object *extraout_RAX;
  Object *pOVar3;
  Ref local_20;
  
  pOVar3 = (store->objects_).list_.
           super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>.
           _M_impl.super__Vector_impl_data._M_start[ref.index];
  if ((((ulong)pOVar3 & 1) == 0) && (pOVar3->kind_ == Trap)) {
    local_20.index = ref.index;
    IVar2 = FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>(&store->roots_,&local_20);
    this->root_index_ = IVar2;
    pTVar1 = (Trap *)(store->objects_).list_.
                     super__Vector_base<wabt::interp::Object_*,_std::allocator<wabt::interp::Object_*>_>
                     ._M_impl.super__Vector_impl_data._M_start[ref.index];
    if (((ulong)pTVar1 & 1) == 0) {
      this->obj_ = pTVar1;
      this->store_ = store;
      return;
    }
  }
  else {
    if (ref.index == 0) {
      interp::RefPtr((interp *)0x0);
      pOVar3 = extraout_RAX;
    }
    if (((ulong)pOVar3 & 1) == 0) {
      interp::RefPtr((interp *)(long)(int)pOVar3->kind_);
    }
  }
  __assert_fail("IsUsed(index)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/include/wabt/interp/interp-inl.h"
                ,0xe6,
                "T &wabt::interp::FreeList<wabt::interp::Object *>::Get(Index) [T = wabt::interp::Object *]"
               );
}

Assistant:

RefPtr<T>::RefPtr(Store& store, Ref ref) {
#ifndef NDEBUG
  if (!store.Is<T>(ref)) {
    ObjectKind ref_kind;
    if (ref == Ref::Null) {
      ref_kind = ObjectKind::Null;
    } else {
      ref_kind = store.objects_.Get(ref.index)->kind();
    }
    fprintf(stderr, "Invalid conversion from Ref (%s) to RefPtr<%s>!\n",
            GetName(ref_kind), T::GetTypeName());
    abort();
  }
#endif
  root_index_ = store.NewRoot(ref);
  obj_ = static_cast<T*>(store.objects_.Get(ref.index));
  store_ = &store;
}